

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O1

MPP_RET allocator_ion_open(void **ctx,size_t alignment,MppAllocFlagType flags)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  RK_S32 RVar4;
  MPP_RET MVar5;
  size_t *psVar6;
  FILE *__stream;
  size_t sVar7;
  size_t extraout_RDX;
  size_t max_length;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t max_length_00;
  size_t extraout_RDX_03;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  char path [256];
  int local_15c;
  size_t local_158;
  void **local_150;
  uint local_148;
  MppAllocFlagType local_144;
  size_t *local_140;
  char local_138 [264];
  
  if (ctx == (void **)0x0) {
    _mpp_log_l(2,"mpp_ion","os_allocator_open Android do not accept NULL input\n",(char *)0x0);
    MVar5 = MPP_ERR_NULL_PTR;
  }
  else {
    *ctx = (void *)0x0;
    uVar3 = open64("/dev/ion",0x80002);
    if ((int)uVar3 < 0) {
      _mpp_log_l(2,"mpp_ion","open %s failed!\n",(char *)0x0,"/dev/ion");
      MVar5 = MPP_ERR_UNKNOW;
    }
    else {
      if (((byte)ion_debug & 2) != 0) {
        _mpp_log_l(4,"mpp_ion","open ion dev fd %d\n",(char *)0x0,(ulong)uVar3);
      }
      psVar6 = (size_t *)mpp_osal_malloc("allocator_ion_open",0x10);
      if (psVar6 == (size_t *)0x0) {
        close(uVar3);
        _mpp_log_l(2,"mpp_ion","os_allocator_open Android failed to allocate context\n",(char *)0x0)
        ;
        MVar5 = MPP_ERR_MALLOC;
      }
      else {
        pthread_mutex_lock((pthread_mutex_t *)&lock);
        if (ion_heap_id < 0) {
          uVar10 = 0;
          local_158 = alignment;
          local_150 = ctx;
          local_148 = uVar3;
          local_144 = flags;
          local_140 = psVar6;
          mpp_env_get_u32("ion_debug",&ion_debug,0);
          bVar11 = true;
          puVar8 = &check_sysfs_iommu_dts_devices;
          max_length_00 = extraout_RDX;
          do {
            builtin_strncpy(local_138,"/proc/device-tree",0x12);
            pcVar1 = (char *)*puVar8;
            RVar4 = find_dir_in_path(local_138,pcVar1,max_length_00);
            max_length_00 = max_length;
            if (RVar4 != 0) {
              RVar4 = find_dir_in_path(local_138,"iommu_enabled",max_length);
              max_length_00 = extraout_RDX_00;
              if (RVar4 != 0) {
                __stream = fopen64(local_138,"rb");
                max_length_00 = extraout_RDX_01;
                if (__stream != (FILE *)0x0) {
                  local_15c = 0;
                  sVar7 = fread(&local_15c,4,1,__stream);
                  if (sVar7 != 0) {
                    _mpp_log_l(4,"mpp_ion","%s iommu_enabled %d\n",(char *)0x0,pcVar1,
                               (ulong)(local_15c != 0));
                  }
                  fclose(__stream);
                  uVar3 = (uint)(local_15c != 0);
                  max_length_00 = extraout_RDX_02;
                  goto LAB_0011c426;
                }
                break;
              }
            }
            bVar11 = uVar10 < 4;
            uVar10 = uVar10 + 1;
            puVar8 = puVar8 + 1;
          } while (uVar10 != 5);
          uVar3 = 0;
LAB_0011c426:
          if (!bVar11) {
            lVar9 = 0;
            do {
              builtin_strncpy(local_138 + 0x10,"g/ion/heaps",0xc);
              builtin_strncpy(local_138,"/sys/kernel/debu",0x10);
              pcVar1 = *(char **)((long)&check_sysfs_iommu_system_heaps + lVar9);
              RVar4 = find_dir_in_path(local_138,pcVar1,max_length_00);
              if (RVar4 != 0) {
                _mpp_log_l(4,"mpp_ion","%s found\n",(char *)0x0,pcVar1);
                uVar3 = 1;
                bVar2 = true;
                goto LAB_0011c499;
              }
              lVar9 = lVar9 + 8;
              max_length_00 = extraout_RDX_03;
            } while (lVar9 == 8);
          }
          bVar2 = false;
LAB_0011c499:
          psVar6 = local_140;
          ctx = local_150;
          alignment = local_158;
          if (!bVar11 && !bVar2) {
            uVar3 = 2;
            _mpp_log_l(2,"mpp_ion","can not find any hint from all possible devices\n",(char *)0x0);
          }
          uVar10 = (ulong)(uVar3 << 2);
          ion_heap_mask = *(RK_U32 *)((long)&DAT_00149df8 + uVar10);
          ion_heap_id = *(RK_S32 *)((long)&DAT_00149e04 + uVar10);
          _mpp_log_l(4,"mpp_ion","using ion heap %s\n",(char *)0x0,
                     (long)&DAT_00149e10 + (long)*(int *)((long)&DAT_00149e10 + uVar10));
          flags = local_144;
          uVar3 = local_148;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&lock);
        *psVar6 = alignment;
        *(MppAllocFlagType *)((long)psVar6 + 0xc) = flags;
        *(uint *)(psVar6 + 1) = uVar3;
        *ctx = psVar6;
        MVar5 = MPP_OK;
      }
    }
  }
  return MVar5;
}

Assistant:

static MPP_RET allocator_ion_open(void **ctx, size_t alignment, MppAllocFlagType flags)
{
    RK_S32 fd;
    allocator_ctx_ion *p;

    if (NULL == ctx) {
        mpp_err("os_allocator_open Android do not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    *ctx = NULL;

    fd = open(dev_ion, O_RDWR | O_CLOEXEC);
    if (fd < 0) {
        mpp_err("open %s failed!\n", dev_ion);
        return MPP_ERR_UNKNOW;
    }

    ion_dbg(ION_DEVICE, "open ion dev fd %d\n", fd);

    p = mpp_malloc(allocator_ctx_ion, 1);
    if (NULL == p) {
        close(fd);
        mpp_err("os_allocator_open Android failed to allocate context\n");
        return MPP_ERR_MALLOC;
    } else {
        /*
         * do heap id detection here:
         * if there is no vpu_service use default ION_HEAP_TYPE_SYSTEM_CONTIG
         * if there is vpu_service then check the iommu_enable status
         */
        pthread_mutex_lock(&lock);
        if (ion_heap_id < 0) {
            int detect_result = check_sysfs_iommu();
            const char *heap_name = NULL;

            switch (detect_result) {
            case ION_DETECT_IOMMU_DISABLE : {
                ion_heap_mask   = (1 << ION_HEAP_TYPE_DMA);
                ion_heap_id     = ION_HEAP_TYPE_DMA;
                heap_name = "ION_HEAP_TYPE_DMA";
            } break;
            case ION_DETECT_IOMMU_ENABLE : {
                ion_heap_mask   = (1 << ION_HEAP_TYPE_SYSTEM);
                ion_heap_id     = ION_HEAP_TYPE_SYSTEM;
                heap_name = "ION_HEAP_TYPE_SYSTEM";
            } break;
            case ION_DETECT_NO_DTS : {
                ion_heap_mask   = (1 << ION_HEAP_TYPE_CARVEOUT);
                ion_heap_id     = ION_HEAP_TYPE_CARVEOUT;
                heap_name = "ION_HEAP_TYPE_CARVEOUT";
            } break;
            default : {
                mpp_err("invalid detect result %d\n", detect_result);
                ion_heap_mask   = (1 << ION_HEAP_TYPE_DMA);
                ion_heap_id     = ION_HEAP_TYPE_DMA;
                heap_name = "ION_HEAP_TYPE_DMA";
            } break;
            }
            mpp_log("using ion heap %s\n", heap_name);
        }
        pthread_mutex_unlock(&lock);
        p->alignment    = alignment;
        p->flags        = flags;
        p->ion_device   = fd;
        *ctx = p;
    }

    return MPP_OK;
}